

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

extent_t *
extent_try_coalesce_impl
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,rtree_ctx_t *rtree_ctx,
          extents_t *extents,extent_t *extent,_Bool *coalesced,_Bool growing_retained,
          _Bool inactive_only)

{
  _Bool _Var1;
  uint uVar2;
  extent_t *peVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  _Bool _Var9;
  extents_t *extents_00;
  
  do {
    peVar3 = extent_lock_from_addr
                       (tsdn,rtree_ctx,
                        (void *)(((extent->field_2).e_size_esn & 0xfffffffffffff000) +
                                ((ulong)extent->e_addr & 0xfffffffffffff000)),growing_retained);
    extents_00 = extents;
    if (peVar3 == (extent_t *)0x0) {
LAB_0012dcc0:
      _Var1 = false;
    }
    else {
      if (((arena_t *)arenas[(uint)peVar3->e_bits & 0xfff].repr == arena) &&
         (((extent_state_t)(peVar3->e_bits >> 0x10) & extent_state_retained) == extents->state)) {
        bVar8 = ((uint)peVar3->e_bits >> 0xd & 1) == 0 ^
                (*(byte *)((long)&extent->e_bits + 1) & 0x20) >> 5;
      }
      else {
        bVar8 = 0;
      }
      uVar4 = ((long)peVar3 * -0x775ed61580000000 |
              (ulong)((long)peVar3 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^ 0xd50dcc13
      ;
      uVar6 = uVar4 + 0xd50dcc13;
      uVar4 = uVar4 + 0x1aa1b9826;
      uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
      lVar7 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
      uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
      lVar5 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
      uVar2 = ((uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5) +
              ((uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7) & 0xff;
      extent_mutex_pool.mutexes[uVar2].field_0.field_0.locked.repr = false;
      pthread_mutex_unlock
                ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar2].field_0 + 0x40));
      extents_00 = extents;
      if (bVar8 == 0) goto LAB_0012dcc0;
      _Var1 = extent_coalesce(tsdn,arena,r_extent_hooks,extents,extent,peVar3,true,SUB81(extents,0))
      ;
      if (_Var1) {
        _Var1 = false;
      }
      else {
        _Var9 = true;
        peVar3 = extent;
        _Var1 = true;
        if (extents->delay_coalesce != false) goto LAB_0012deab;
      }
    }
    _Var9 = _Var1;
    peVar3 = extent_lock_from_addr
                       (tsdn,rtree_ctx,
                        (void *)(((ulong)extent->e_addr & 0xfffffffffffff000) - 0x1000),
                        growing_retained);
    if (peVar3 != (extent_t *)0x0) {
      if (((arena_t *)arenas[(uint)peVar3->e_bits & 0xfff].repr == arena) &&
         (((extent_state_t)(peVar3->e_bits >> 0x10) & extent_state_retained) == extents_00->state))
      {
        bVar8 = ((uint)peVar3->e_bits >> 0xd & 1) == 0 ^
                (*(byte *)((long)&extent->e_bits + 1) & 0x20) >> 5;
      }
      else {
        bVar8 = 0;
      }
      uVar4 = ((long)peVar3 * -0x775ed61580000000 |
              (ulong)((long)peVar3 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^ 0xd50dcc13
      ;
      uVar6 = uVar4 + 0xd50dcc13;
      uVar4 = uVar4 + 0x1aa1b9826;
      uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
      lVar7 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
      uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
      lVar5 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
      uVar2 = ((uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5) +
              ((uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7) & 0xff;
      extent_mutex_pool.mutexes[uVar2].field_0.field_0.locked.repr = false;
      pthread_mutex_unlock
                ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar2].field_0 + 0x40));
      if (((bVar8 != 0) &&
          (_Var1 = extent_coalesce(tsdn,arena,r_extent_hooks,extents_00,extent,peVar3,false,
                                   SUB81(extents_00,0)), !_Var1)) &&
         (_Var9 = true, extent = peVar3, extents_00->delay_coalesce != false)) goto LAB_0012deab;
    }
    extents = extents_00;
  } while (_Var9 != false);
  peVar3 = extent;
  if (extents_00->delay_coalesce == true) {
    _Var9 = false;
LAB_0012deab:
    *coalesced = _Var9;
  }
  return peVar3;
}

Assistant:

static extent_t *
extent_try_coalesce_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, rtree_ctx_t *rtree_ctx, extents_t *extents,
    extent_t *extent, bool *coalesced, bool growing_retained,
    bool inactive_only) {
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		extent_t *next = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_past_get(extent), inactive_only);
		if (next != NULL) {
			/*
			 * extents->mtx only protects against races for
			 * like-state extents, so call extent_can_coalesce()
			 * before releasing next's pool lock.
			 */
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, next);

			extent_unlock(tsdn, next);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, next, true,
			    growing_retained)) {
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		extent_t *prev = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_before_get(extent), inactive_only);
		if (prev != NULL) {
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, prev);
			extent_unlock(tsdn, prev);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, prev, false,
			    growing_retained)) {
				extent = prev;
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}
	} while (again);

	if (extents->delay_coalesce) {
		*coalesced = false;
	}
	return extent;
}